

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

void cleanup(EVP_PKEY_CTX *ctx)

{
  archive_string *as;
  void *pvVar1;
  void *__ptr;
  
  as = (archive_string *)**(undefined8 **)(ctx + 0x818);
  __ptr = (void *)as[2].buffer_length;
  while (__ptr != (void *)0x0) {
    pvVar1 = *(void **)((long)__ptr + 0x20);
    free(*(void **)((long)__ptr + 0x30));
    free_options(*(mtree_option **)((long)__ptr + 0x28));
    free(__ptr);
    __ptr = pvVar1;
  }
  archive_string_free(as);
  archive_string_free(as + 4);
  archive_string_free(as + 5);
  archive_entry_linkresolver_free((archive_entry_linkresolver *)as[6].s);
  free((void *)as[1].length);
  free(as);
  **(undefined8 **)(ctx + 0x818) = 0;
  return;
}

Assistant:

static int
cleanup(struct archive_read *a)
{
	struct mtree *mtree;
	struct mtree_entry *p, *q;

	mtree = (struct mtree *)(a->format->data);

	p = mtree->entries;
	while (p != NULL) {
		q = p->next;
		free(p->name);
		free_options(p->options);
		free(p);
		p = q;
	}
	archive_string_free(&mtree->line);
	archive_string_free(&mtree->current_dir);
	archive_string_free(&mtree->contents_name);
	archive_entry_linkresolver_free(mtree->resolver);

	free(mtree->buff);
	free(mtree);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}